

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputBufferedStream.cpp
# Opt level: O3

void __thiscall OutputBufferedStream::~OutputBufferedStream(OutputBufferedStream *this)

{
  Byte *pBVar1;
  
  (this->super_IByteWriterWithPosition).super_IByteWriter._vptr_IByteWriter =
       (_func_int **)&PTR__OutputBufferedStream_003a7c70;
  if (this->mTargetStream != (IByteWriterWithPosition *)0x0) {
    if (this->mCurrentBufferIndex != this->mBuffer) {
      (*(this->mTargetStream->super_IByteWriter)._vptr_IByteWriter[2])();
    }
  }
  pBVar1 = this->mBuffer;
  this->mCurrentBufferIndex = pBVar1;
  if (pBVar1 != (Byte *)0x0) {
    operator_delete__(pBVar1);
  }
  if (this->mTargetStream != (IByteWriterWithPosition *)0x0) {
    (*(this->mTargetStream->super_IByteWriter)._vptr_IByteWriter[1])();
    return;
  }
  return;
}

Assistant:

OutputBufferedStream::~OutputBufferedStream(void)
{
	Flush();
	delete[] mBuffer;
	delete mTargetStream;
}